

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>>::
write_int<unsigned__int128,duckdb_fmt::v6::basic_format_specs<wchar_t>>
          (basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>> *this,unsigned___int128 value,
          basic_format_specs<wchar_t> *spec)

{
  byte bVar1;
  basic_format_specs<wchar_t> *in_RCX;
  undefined1 local_38 [32];
  char local_18;
  uint local_14;
  
  local_14 = 0;
  bVar1 = (byte)in_RCX->field_0x9 >> 4 & 7;
  if (1 < bVar1) {
    local_18 = ' ';
    if (bVar1 == 2) {
      local_18 = '+';
    }
    local_14 = 1;
  }
  local_38._0_8_ = this;
  local_38._16_8_ = spec;
  handle_int_type_spec<duckdb_fmt::v6::basic_format_specs<wchar_t>,duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>>::int_writer<unsigned__int128,duckdb_fmt::v6::basic_format_specs<wchar_t>>>
            (in_RCX,(int_writer<unsigned___int128,_duckdb_fmt::v6::basic_format_specs<wchar_t>_> *)
                    local_38);
  return;
}

Assistant:

void write_int(T value, const Spec& spec) {
    handle_int_type_spec(spec, int_writer<T, Spec>(*this, value, spec));
  }